

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O2

void __thiscall gui::Container::setVisible(Container *this,bool visible)

{
  pointer psVar1;
  undefined7 in_register_00000031;
  shared_ptr<gui::Widget> *c;
  pointer psVar2;
  
  if ((int)CONCAT71(in_register_00000031,visible) == 0) {
    psVar1 = (this->super_ContainerBase).children_.
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar2 = (this->super_ContainerBase).children_.
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1)
    {
      Widget::setFocused((psVar2->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,false);
    }
  }
  Widget::setVisible(&this->super_Widget,visible);
  return;
}

Assistant:

void Container::setVisible(bool visible) {
    if (!visible) {
        for (const auto& c : children_) {
            c->setFocused(false);
        }
    }
    Widget::setVisible(visible);
}